

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

unique_ptr<perfetto::TracingSession,_std::default_delete<perfetto::TracingSession>_> __thiscall
perfetto::internal::TracingMuxerImpl::CreateTracingSession
          (TracingMuxerImpl *this,BackendType requested_backend_type)

{
  uint uVar1;
  code *pcVar2;
  char *fname;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  pointer pTVar6;
  TracingSessionImpl *this_00;
  BackendType in_EDX;
  undefined4 in_register_00000034;
  TracingMuxerImpl *muxer;
  anon_class_24_3_d7f50073 local_60;
  function<void_()> local_48;
  __int_type_conflict4 local_28;
  TracingSessionGlobalID session_id;
  TracingMuxerImpl *pTStack_18;
  BackendType requested_backend_type_local;
  TracingMuxerImpl *this_local;
  
  muxer = (TracingMuxerImpl *)CONCAT44(in_register_00000034,requested_backend_type);
  session_id._4_4_ = in_EDX;
  pTStack_18 = muxer;
  this_local = this;
  local_28 = std::__atomic_base<unsigned_long>::operator++
                       (&(muxer->next_tracing_session_id_).super___atomic_base<unsigned_long>);
  if ((session_id._4_4_ & session_id._4_4_ - kInProcessBackend) == kUnspecifiedBackend) {
    pTVar6 = std::
             unique_ptr<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
             ::operator->(&muxer->task_runner_);
    local_60.requested_backend_type = session_id._4_4_;
    local_60.session_id = local_28;
    local_60.this = muxer;
    ::std::function<void()>::
    function<perfetto::internal::TracingMuxerImpl::CreateTracingSession(perfetto::BackendType)::__0,void>
              ((function<void()> *)&local_48,&local_60);
    (*pTVar6->_vptr_TaskRunner[2])(pTVar6,&local_48);
    ::std::function<void_()>::~function(&local_48);
    this_00 = (TracingSessionImpl *)operator_new(0x20);
    TracingSessionImpl::TracingSessionImpl(this_00,muxer,local_28,session_id._4_4_);
    ::std::unique_ptr<perfetto::TracingSession,std::default_delete<perfetto::TracingSession>>::
    unique_ptr<std::default_delete<perfetto::TracingSession>,void>
              ((unique_ptr<perfetto::TracingSession,std::default_delete<perfetto::TracingSession>> *
               )this,(pointer)this_00);
    return (__uniq_ptr_data<perfetto::TracingSession,_std::default_delete<perfetto::TracingSession>,_true,_true>
            )(__uniq_ptr_data<perfetto::TracingSession,_std::default_delete<perfetto::TracingSession>,_true,_true>
              )this;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  perfetto::base::LogMessage
            (kLogError,fname,0xad77,"%s (errno: %d, %s)",
             "PERFETTO_CHECK((requested_backend_type & (requested_backend_type - 1)) == 0)",
             (ulong)uVar1,pcVar5);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

std::unique_ptr<TracingSession> TracingMuxerImpl::CreateTracingSession(
    BackendType requested_backend_type) {
  TracingSessionGlobalID session_id = ++next_tracing_session_id_;

  // |backend_type| can only specify one backend, not an OR-ed mask.
  PERFETTO_CHECK((requested_backend_type & (requested_backend_type - 1)) == 0);

  // Capturing |this| is fine because the TracingMuxer is a leaky singleton.
  task_runner_->PostTask([this, requested_backend_type, session_id] {
    for (RegisteredBackend& backend : backends_) {
      if (requested_backend_type && backend.type &&
          backend.type != requested_backend_type) {
        continue;
      }

      TracingBackendId backend_id = backend.id;

      // Create the consumer now, even if we have to ask the embedder below, so
      // that any other tasks executing after this one can find the consumer and
      // change its pending attributes.
      backend.consumers.emplace_back(
          new ConsumerImpl(this, backend.type, backend.id, session_id));

      // The last registered backend in |backends_| is the unsupported backend
      // without a valid type.
      if (!backend.type) {
        PERFETTO_ELOG(
            "No tracing backend ready for type=%d, consumer will disconnect",
            requested_backend_type);
        InitializeConsumer(session_id);
        return;
      }

      // Check if the embedder wants to be asked for permission before
      // connecting the consumer.
      if (!policy_) {
        InitializeConsumer(session_id);
        return;
      }

      TracingPolicy::ShouldAllowConsumerSessionArgs args;
      args.backend_type = backend.type;
      args.result_callback = [this, backend_id, session_id](bool allow) {
        task_runner_->PostTask([this, backend_id, session_id, allow] {
          if (allow) {
            InitializeConsumer(session_id);
            return;
          }

          PERFETTO_ELOG(
              "Consumer session for backend type type=%d forbidden, "
              "consumer will disconnect",
              backends_[backend_id].type);

          auto* consumer = FindConsumer(session_id);
          if (!consumer)
            return;

          consumer->OnDisconnect();
        });
      };
      policy_->ShouldAllowConsumerSession(args);
      return;
    }
    PERFETTO_DFATAL("Not reached");
  });

  return std::unique_ptr<TracingSession>(
      new TracingSessionImpl(this, session_id, requested_backend_type));
}